

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void testing::internal::
     PrintTo<std::__cxx11::basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>>
               (basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
                *value,ostream *os)

{
  IsContainer IVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  
  IVar1 = IsContainerTest<std::__cxx11::basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>>
                    (0,(iterator *)0x0,(const_iterator *)0x0);
  DefaultPrintTo<std::__cxx11::basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>>
            (IVar1,in_RDI,in_RSI);
  return;
}

Assistant:

void PrintTo(const T& value, ::std::ostream* os) {
  // DefaultPrintTo() is overloaded.  The type of its first two
  // arguments determine which version will be picked.  If T is an
  // STL-style container, the version for container will be called; if
  // T is a pointer, the pointer version will be called; otherwise the
  // generic version will be called.
  //
  // Note that we check for container types here, prior to we check
  // for protocol message types in our operator<<.  The rationale is:
  //
  // For protocol messages, we want to give people a chance to
  // override Google Mock's format by defining a PrintTo() or
  // operator<<.  For STL containers, other formats can be
  // incompatible with Google Mock's format for the container
  // elements; therefore we check for container types here to ensure
  // that our format is used.
  //
  // The second argument of DefaultPrintTo() is needed to bypass a bug
  // in Symbian's C++ compiler that prevents it from picking the right
  // overload between:
  //
  //   PrintTo(const T& x, ...);
  //   PrintTo(T* x, ...);
  DefaultPrintTo(IsContainerTest<T>(0), is_pointer<T>(), value, os);
}